

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

bool __thiscall
kws::Parser::IsBetweenCharsFast
          (Parser *this,char begin,char end,size_t pos,bool withComments,string *buffer)

{
  bool bVar1;
  ulong uVar2;
  ulong in_RCX;
  char in_DL;
  char in_SIL;
  long in_RDI;
  byte in_R8B;
  string *in_R9;
  size_t b1;
  size_t b0;
  string stream;
  ulong local_70;
  ulong local_68;
  string local_50 [47];
  byte local_21;
  ulong local_20;
  char local_12;
  char local_11;
  byte local_1;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_12 = in_DL;
  local_11 = in_SIL;
  std::__cxx11::string::string(local_50,in_R9);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) &&
     (std::__cxx11::string::operator=(local_50,(string *)(in_RDI + 0x518)), (local_21 & 1) != 0)) {
    std::__cxx11::string::operator=(local_50,(string *)(in_RDI + 0x4f8));
  }
  if (local_20 == 0xffffffffffffffff) {
    local_1 = 0;
  }
  else {
    local_68 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_11);
    local_70 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_12);
    while( true ) {
      bVar1 = false;
      if ((local_68 != 0xffffffffffffffff) && (bVar1 = false, local_70 != 0xffffffffffffffff)) {
        bVar1 = local_68 < local_70;
      }
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0013a40d;
      }
      if ((local_68 < local_20) && (local_20 < local_70)) break;
      local_68 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_11);
      local_70 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_12);
    }
    local_1 = 1;
  }
LAB_0013a40d:
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::IsBetweenCharsFast(const char begin, const char end ,size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  size_t b0 = stream.find(begin,0);
  size_t b1 = stream.find(end,b0);

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(begin,b0+1);
    b1 = stream.find(end,b0);
    }
  return false;
}